

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O2

NamedVertex * __thiscall
gss::innards::HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
          (NamedVertex *__return_storage_ptr__,HomomorphismModel *this,int v)

{
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var1;
  long lVar2;
  ProofError *this_00;
  allocator<char> local_31;
  string local_30;
  
  if (-1 < v) {
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    lVar2 = *(long *)&((_Var1._M_head_impl)->pattern_vertex_proof_names).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    if ((ulong)(uint)v <
        (ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->pattern_vertex_proof_names + 8) -
                lVar2 >> 5)) {
      __return_storage_ptr__->first = v;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->second,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (lVar2 + (ulong)(uint)v * 0x20));
      return __return_storage_ptr__;
    }
  }
  this_00 = (ProofError *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Oops, there\'s a bug: v out of range in pattern",&local_31);
  ProofError::ProofError(this_00,&local_30);
  __cxa_throw(this_00,&ProofError::typeinfo,ProofError::~ProofError);
}

Assistant:

auto HomomorphismModel::pattern_vertex_for_proof(int v) const -> NamedVertex
{
    if (v < 0 || unsigned(v) >= _imp->pattern_vertex_proof_names.size())
        throw ProofError{"Oops, there's a bug: v out of range in pattern"};
    return pair{v, _imp->pattern_vertex_proof_names[v]};
}